

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.h
# Opt level: O3

char * cinatra::detail::parse_headers
                 (char *buf,char *buf_end,http_header *headers,size_t *num_headers,
                 size_t max_headers,int *ret,bool *has_connection,bool *has_close,bool *has_upgrade)

{
  char cVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  size_t sVar5;
  char *buf_00;
  char *pcVar6;
  size_t value_len;
  byte *local_40;
  size_t local_38;
  
  if (buf != buf_end) {
    do {
      cVar1 = *buf;
      if (cVar1 == '\n') {
        return buf + 1;
      }
      if (cVar1 == '\r') {
        iVar4 = -2;
        if ((buf + 1 != buf_end) && (iVar4 = -1, buf[1] == '\n')) {
          return buf + 2;
        }
        goto LAB_001177d6;
      }
      iVar4 = -1;
      if (*num_headers == max_headers) goto LAB_001177d6;
      if ((*num_headers == 0) || ((cVar1 != '\t' && (cVar1 != ' ')))) {
        sVar5 = 0;
        while ((ulong)(byte)buf[sVar5] != 0x3a) {
          if (""[(byte)buf[sVar5]] == '\0') goto LAB_001177d6;
          lVar3 = sVar5 + 1;
          sVar5 = sVar5 + 1;
          if (buf + lVar3 == buf_end) goto LAB_001177d1;
        }
        if (sVar5 == 0) goto LAB_001177d6;
        buf_00 = buf + sVar5;
        do {
          buf_00 = buf_00 + 1;
          if (buf_00 == buf_end) goto LAB_001177d1;
        } while ((*buf_00 == ' ') || (pcVar6 = buf, *buf_00 == '\t'));
      }
      else {
        sVar5 = 0;
        buf_00 = buf;
        pcVar6 = (char *)0x0;
      }
      buf = get_token_to_eol(buf_00,buf_end,(char **)&local_40,&local_38,ret);
      if (buf == (char *)0x0) {
        return (char *)0x0;
      }
      if ((sVar5 == 10) && (pcVar6[9] == 'n' && *(long *)(pcVar6 + 1) == 0x6f697463656e6e6f)) {
        *has_connection = true;
        if ((*local_40 & 0xdf) == 0x43) {
          *has_close = true;
        }
        else if ((*local_40 & 0xdf) == 0x55) {
          *has_upgrade = true;
        }
      }
      sVar2 = *num_headers;
      headers[sVar2].name._M_len = sVar5;
      headers[sVar2].name._M_str = pcVar6;
      headers[sVar2].value._M_len = local_38;
      headers[sVar2].value._M_str = (char *)local_40;
      *num_headers = *num_headers + 1;
    } while (buf != buf_end);
  }
LAB_001177d1:
  iVar4 = -2;
LAB_001177d6:
  *ret = iVar4;
  return (char *)0x0;
}

Assistant:

static const char *parse_headers(const char *buf, const char *buf_end,
                                 http_header *headers, size_t *num_headers,
                                 size_t max_headers, int *ret,
                                 bool &has_connection, bool &has_close,
                                 bool &has_upgrade) {
  for (;; ++*num_headers) {
    const char *name;
    size_t name_len;
    const char *value;
    size_t value_len;
    CHECK_EOF();
    if (*buf == '\015') {
      ++buf;
      EXPECT_CHAR('\012');
      break;
    }
    else if (*buf == '\012') {
      ++buf;
      break;
    }
    if (*num_headers == max_headers) {
      *ret = -1;
      return NULL;
    }
    if (!(*num_headers != 0 && (*buf == ' ' || *buf == '\t'))) {
      /* parsing name, but do not discard SP before colon, see
       * http://www.mozilla.org/security/announce/2006/mfsa2006-33.html */
      name = buf;
      static const char ALIGNED(16) ranges1[] =
          "\x00 "  /* control chars and up to SP */
          "\"\""   /* 0x22 */
          "()"     /* 0x28,0x29 */
          ",,"     /* 0x2c */
          "//"     /* 0x2f */
          ":@"     /* 0x3a-0x40 */
          "[]"     /* 0x5b-0x5d */
          "{\377"; /* 0x7b-0xff */
      int found;
      buf = findchar_fast(buf, buf_end, ranges1, sizeof(ranges1) - 1, &found);
      if (!found) {
        CHECK_EOF();
      }
      while (1) {
        if (*buf == ':') {
          break;
        }
        else if (!token_char_map[(unsigned char)*buf]) {
          *ret = -1;
          return NULL;
        }
        ++buf;
        CHECK_EOF();
      }
      if ((name_len = buf - name) == 0) {
        *ret = -1;
        return NULL;
      }
      ++buf;
      for (;; ++buf) {
        CHECK_EOF();
        if (!(*buf == ' ' || *buf == '\t')) {
          break;
        }
      }
    }
    else {
      name = NULL;
      name_len = 0;
    }
    if ((buf = get_token_to_eol(buf, buf_end, &value, &value_len, ret)) ==
        NULL) {
      return NULL;
    }
    if (name_len == 10) {
      if (memcmp(name + 1, "onnection", name_len - 1) == 0) {
        // has connection
        has_connection = true;
        char ch = *value;
        if (ch == 'U' || ch == 'u') {
          // has upgrade
          has_upgrade = true;
        }
        else if (ch == 'c' || ch == 'C') {
          // has_close
          has_close = true;
        }
      }
    }
    headers[*num_headers] = {std::string_view{name, name_len},
                             std::string_view{value, value_len}};
  }
  return buf;
}